

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void min_w_cb(Fl_Value_Input *i,void *v)

{
  double dVar1;
  _func_int **pp_Var2;
  int iVar3;
  Fl_Type *pFVar4;
  bool bVar5;
  
  if ((char *)v == "LOAD") {
    iVar3 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    pp_Var2 = (((i->super_Fl_Valuator).super_Fl_Widget.parent_)->super_Fl_Widget)._vptr_Fl_Widget;
    if (iVar3 == 0) {
      (*pp_Var2[6])();
      return;
    }
    (*pp_Var2[5])();
    Fl_Valuator::value(&i->super_Fl_Valuator,(double)current_widget[1].super_Fl_Type.level);
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    dVar1 = (i->super_Fl_Valuator).value_;
    bVar5 = true;
    pFVar4 = Fl_Type::first;
    do {
      while ((pFVar4->selected != '\0' &&
             (iVar3 = (*pFVar4->_vptr_Fl_Type[0x21])(pFVar4), iVar3 != 0))) {
        current_widget[1].super_Fl_Type.level = (int)dVar1;
        pFVar4 = pFVar4->next;
        bVar5 = false;
        if (pFVar4 == (Fl_Type *)0x0) goto LAB_00185edc;
      }
      pFVar4 = pFVar4->next;
    } while (pFVar4 != (Fl_Type *)0x0);
    if (!bVar5) {
LAB_00185edc:
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void min_w_cb(Fl_Value_Input* i, void* v) {
  if (v == LOAD) {
    if (!current_widget->is_window()) {i->parent()->hide(); return;}
    i->parent()->show();
    i->value(((Fl_Window_Type*)current_widget)->sr_min_w);
  } else {
    int mod = 0;
    int n = (int)i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_window()) {
        ((Fl_Window_Type*)current_widget)->sr_min_w = n;
        mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}